

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::v5::internal::udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125>::
operator()(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125> *this,
          int *args)

{
  size_t sVar1;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_string_view<char> format_str_00;
  char s [7];
  char local_260 [8];
  ulong local_258 [3];
  format_string_checker<char,_fmt::v5::internal::error_handler,_int> local_240 [13];
  
  builtin_strncpy(local_260,"{0:10}",7);
  local_240[0].arg_id_ = 0xffffffff;
  local_240[0].context_.format_str_.size_ = 6;
  local_240[0].context_._16_8_ = local_240[0].context_._16_8_ & 0xffffffff00000000;
  local_240[0].parse_funcs_[0] =
       parse_format_specs<int,fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>;
  format_str_00.size_ = 6;
  format_str_00.data_ = local_260;
  local_240[0].context_.format_str_.data_ = local_260;
  parse_format_string<true,char,fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler,int>&>
            (format_str_00,local_240);
  sVar1 = strlen(local_260);
  local_258[0] = (ulong)(uint)*args;
  local_240[0].context_.format_str_.size_ = 0;
  local_240[0]._0_8_ = &PTR_grow_002a8bf0;
  local_240[0].context_.next_arg_id_ = 500;
  local_240[0].context_._20_4_ = 0;
  format_str.size_ = sVar1;
  format_str.data_ = local_260;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_258;
  args_00.types_ =
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_240[0].context_.format_str_.data_ = (char *)local_240[0].parse_funcs_;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_240,format_str,args_00,(locale_ref)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_240[0].context_.format_str_.data_,
             (undefined1 *)
             ((long)local_240[0].context_.format_str_.data_ +
             local_240[0].context_.format_str_.size_));
  local_240[0]._0_8_ = &PTR_grow_002a8bf0;
  if ((parse_func *)local_240[0].context_.format_str_.data_ != local_240[0].parse_funcs_) {
    operator_delete(local_240[0].context_.format_str_.data_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> operator()(const Args &... args) const {
    FMT_CONSTEXPR_DECL Char s[] = {CHARS..., '\0'};
    FMT_CONSTEXPR_DECL bool invalid_format =
        do_check_format_string<Char, error_handler, Args...>(
          basic_string_view<Char>(s, sizeof...(CHARS)));
    (void)invalid_format;
    return format(s, args...);
  }